

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.h
# Opt level: O2

bool __thiscall UnifiedRegex::RuntimeCharSet<char16_t>::Get(RuntimeCharSet<char16_t> *this,Char kc)

{
  bool bVar1;
  undefined2 in_register_00000032;
  
  if ((ushort)kc < 0x100) {
    bVar1 = CharBitvec::Get(&this->direct,CONCAT22(in_register_00000032,kc));
    return bVar1;
  }
  if (this->root != (CharSetNode *)0x0) {
    bVar1 = Get_helper(this,CONCAT22(in_register_00000032,kc));
    return bVar1;
  }
  return false;
}

Assistant:

inline bool Get(Char kc) const
        {
            if (CTU(kc) < CharSetNode::directSize)
            {
                return direct.Get(CTU(kc));
            }
            else if (root == 0)
            {
                return false;
            }
            else
            {
                return Get_helper(CTU(kc));
            }
        }